

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

void __thiscall
smf::Option_register::Option_register
          (Option_register *this,string *aDefinition,char aType,string *aDefaultOption)

{
  (this->definition)._M_dataplus._M_p = (pointer)&(this->definition).field_2;
  (this->definition)._M_string_length = 0;
  (this->definition).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  (this->defaultOption)._M_dataplus._M_p = (pointer)&(this->defaultOption).field_2;
  (this->defaultOption)._M_string_length = 0;
  (this->defaultOption).field_2._M_local_buf[0] = '\0';
  (this->modifiedOption)._M_dataplus._M_p = (pointer)&(this->modifiedOption).field_2;
  (this->modifiedOption)._M_string_length = 0;
  (this->modifiedOption).field_2._M_local_buf[0] = '\0';
  this->modifiedQ = false;
  this->type = aType;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->defaultOption);
  return;
}

Assistant:

Option_register::Option_register(const std::string& aDefinition, char aType,
      const std::string& aDefaultOption) {
   type = 's';
   modifiedQ = 0;
   setType(aType);
   setDefinition(aDefinition);
   setDefault(aDefaultOption);
}